

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.h
# Opt level: O0

void __thiscall
CQueue::
AddToQueue<void(*)(char_data*,char_data*,speech_data*),char_data*&,char_data*&,speech_data*&>
          (CQueue *this,int nTimer,string *from,string *funcName,
          _func_void_char_data_ptr_char_data_ptr_speech_data_ptr *func,char_data **args,
          char_data **args_1,speech_data **args_2)

{
  string_view fmt;
  string_view fmt_00;
  string *in_RCX;
  string *in_RDX;
  int in_ESI;
  function<void_()> *in_RDI;
  CLogger *in_R8;
  size_t *in_R9;
  undefined8 *in_stack_00000008;
  vector<char_data_*,_std::allocator<char_data_*>_> chs;
  tuple<char_data_*&,_char_data_*&,_speech_data_*&> tuple;
  speech_data **in_stack_fffffffffffffe88;
  value_type *__x;
  char_data **in_stack_fffffffffffffe90;
  queueEntry_t *this_00;
  char *in_stack_fffffffffffffe98;
  anon_class_32_4_d738bd32 *__f;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffea0;
  function<void_()> *args_2_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed0;
  vector<char_data_*,_std::allocator<char_data_*>_> *in_stack_fffffffffffffed8;
  vector<char_data_*,_std::allocator<char_data_*>_> *in_stack_fffffffffffffee0;
  size_t sVar1;
  char *pcVar2;
  string local_f0 [32];
  undefined1 local_d0 [112];
  anon_class_32_4_d738bd32 local_60;
  size_t *local_30;
  CLogger *local_28;
  
  local_30 = in_R9;
  local_28 = in_R8;
  if (in_ESI < 0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    local_60._24_8_ = 3;
    fmt._M_str = (char *)in_stack_fffffffffffffed8;
    fmt._M_len = (size_t)in_stack_fffffffffffffed0;
    CLogger::Warn<unsigned_long>((CLogger *)in_stack_fffffffffffffec8,fmt,(unsigned_long *)in_RDI);
  }
  __f = &local_60;
  std::tuple<char_data_*&,_char_data_*&,_speech_data_*&>::tuple<true,_true>
            ((tuple<char_data_*&,_char_data_*&,_speech_data_*&> *)in_stack_fffffffffffffea0,
             (char_data **)__f,in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  GetCharacterData<char_data*&,char_data*&,speech_data*&>
            ((CQueue *)in_RDX,(tuple<char_data_*&,_char_data_*&,_speech_data_*&> *)in_RCX);
  args_2_00 = in_RDI;
  std::__cxx11::string::string(local_f0,in_RDX);
  this_00 = (queueEntry_t *)local_d0;
  std::__cxx11::string::string((string *)this_00,in_RCX);
  __x = (value_type *)(local_d0 + 0x20);
  std::vector<char_data_*,_std::allocator<char_data_*>_>::vector
            (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  sVar1 = *local_30;
  pcVar2 = (char *)*in_stack_00000008;
  std::function<void()>::
  function<CQueue::AddToQueue<void(*)(char_data*,char_data*,speech_data*),char_data*&,char_data*&,speech_data*&>(int,std::__cxx11::string,std::__cxx11::string,void(*)(char_data*,char_data*,speech_data*),char_data*&,char_data*&,speech_data*&)::_lambda()_1_,void>
            (in_RDI,__f);
  std::vector<CQueue::queueEntry_t,_std::allocator<CQueue::queueEntry_t>_>::push_back
            ((vector<CQueue::queueEntry_t,_std::allocator<CQueue::queueEntry_t>_> *)this_00,__x);
  queueEntry_t::~queueEntry_t(this_00);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_RDI,(char *)__f);
  fmt_00._M_str = pcVar2;
  fmt_00._M_len = sVar1;
  CLogger::Warn<std::__cxx11::string&,std::__cxx11::string&,int&>
            (local_28,fmt_00,in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,(int *)args_2_00);
  std::vector<char_data_*,_std::allocator<char_data_*>_>::~vector
            ((vector<char_data_*,_std::allocator<char_data_*>_> *)in_RDI);
  return;
}

Assistant:

void AddToQueue(int nTimer, std::string from, std::string funcName, Func func, Args &&...args)
	{
		if(nTimer < 0)
			Logger.Warn("Negative Queue Timer - NumArgs: {}", sizeof...(Args));	

		// print parameters
		//((std::cout << ' ' << args << std::endl), ...);

		// capture parameter pack
		auto tuple = std::tuple<Args...>(args...);
		auto chs = GetCharacterData(tuple);

		// place on queue
		newQueue.push_back({nTimer, from, funcName, chs, [=] () mutable
		{
			std::apply(func, std::forward_as_tuple(std::forward<Args>(args)...));
		}});

		Logger.Warn("Add => {} added {} with timer {}", from, funcName, nTimer);
	}